

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall icu_63::RBBISetBuilder::mergeCategories(RBBISetBuilder *this,IntPair categories)

{
  RangeDescriptor *pRVar1;
  uint uVar2;
  
  pRVar1 = this->fRangeList;
  do {
    if (pRVar1 == (RangeDescriptor *)0x0) {
      this->fGroupCount = this->fGroupCount + -1;
      return;
    }
    uVar2 = pRVar1->fNum;
    if ((uVar2 & 0xffffbfff) == categories.second) {
      uVar2 = uVar2 & 0x4000 | categories.first;
LAB_002abbd0:
      pRVar1->fNum = uVar2;
    }
    else if (categories.second < (int)(uVar2 & 0xffffbfff)) {
      uVar2 = uVar2 - 1;
      goto LAB_002abbd0;
    }
    pRVar1 = pRVar1->fNext;
  } while( true );
}

Assistant:

void RBBISetBuilder::mergeCategories(IntPair categories) {
    U_ASSERT(categories.first >= 1);
    U_ASSERT(categories.second > categories.first);
    for (RangeDescriptor *rd = fRangeList; rd != nullptr; rd = rd->fNext) {
        int32_t rangeNum = rd->fNum & ~DICT_BIT;
        int32_t rangeDict = rd->fNum & DICT_BIT;
        if (rangeNum == categories.second) {
            rd->fNum = categories.first | rangeDict;
        } else if (rangeNum > categories.second) {
            rd->fNum--;
        }
    }
    --fGroupCount;
}